

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O3

void __thiscall spdlog::details::registry::throw_if_exists_(registry *this,string *logger_name)

{
  long lVar1;
  iterator iVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong *puVar6;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->loggers_)._M_h,logger_name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::operator+(&local_38,"logger with name \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)logger_name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  puVar5 = (ulong *)*plVar4;
  puVar6 = (ulong *)(plVar4 + 2);
  if (puVar5 == puVar6) {
    local_48 = *puVar6;
    uStack_40 = (undefined4)plVar4[3];
    uStack_3c = *(undefined4 *)((long)plVar4 + 0x1c);
    puVar5 = &local_48;
  }
  else {
    local_48 = *puVar6;
  }
  lVar1 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  *puVar3 = &PTR__spdlog_ex_0021fd18;
  puVar3[1] = puVar3 + 3;
  if (puVar5 == &local_48) {
    *(undefined4 *)(puVar3 + 3) = (undefined4)local_48;
    *(undefined4 *)((long)puVar3 + 0x1c) = local_48._4_4_;
    *(undefined4 *)(puVar3 + 4) = uStack_40;
    *(undefined4 *)((long)puVar3 + 0x24) = uStack_3c;
  }
  else {
    puVar3[1] = puVar5;
    puVar3[3] = local_48;
  }
  puVar3[2] = lVar1;
  local_48 = local_48 & 0xffffffffffffff00;
  __cxa_throw(puVar3,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

SPDLOG_INLINE void registry::throw_if_exists_(const std::string &logger_name)
{
    if (loggers_.find(logger_name) != loggers_.end())
    {
        SPDLOG_THROW(spdlog_ex("logger with name '" + logger_name + "' already exists"));
    }
}